

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O2

ngx_int_t ngx_http_ssi_if(ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t **params)

{
  byte *pbVar1;
  ngx_log_t *pnVar2;
  void *pvVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ngx_int_t nVar9;
  ngx_connection_t *extraout_RAX;
  ngx_connection_t *pnVar10;
  void *pvVar11;
  char *flags;
  byte *pbVar12;
  size_t sVar13;
  ngx_str_t *pnVar14;
  u_char local_4e8 [8];
  u_char errstr [1024];
  size_t local_a8;
  u_char *local_a0;
  ngx_str_t name;
  undefined1 auStack_68 [8];
  ngx_str_t right;
  undefined1 local_50 [8];
  ngx_str_t left;
  
  bVar5 = ctx->field_0x1a0;
  if ((bVar5 & 3) != 0 && (ctx->command).len == 2) {
    pnVar2 = r->connection->log;
    if (3 < pnVar2->log_level) {
      ngx_log_error_core(4,pnVar2,0,"the \"if\" command inside the \"if\" command");
      return 1;
    }
    return 1;
  }
  if ((bVar5 & 0x40) != 0) {
    bVar5 = bVar5 & 0xdf;
    goto LAB_001596e1;
  }
  pnVar14 = *params;
  pnVar2 = r->connection->log;
  if ((pnVar2->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar2,0,"ssi if expr=\"%V\"",pnVar14);
  }
  left.len = (size_t)pnVar14->data;
  sVar13 = pnVar14->len;
  pbVar1 = (byte *)(left.len + sVar13);
  lVar8 = -left.len;
  flags = (char *)0x2000000000000025;
  for (pbVar12 = (byte *)left.len; pbVar12 < pbVar1; pbVar12 = pbVar12 + 1) {
    bVar5 = *pbVar12;
    if ((byte)(bVar5 + 0xbf) < 0x1a) {
      *pbVar12 = bVar5 | 0x20;
    }
    else if ((9 < (byte)(bVar5 - 0x30) && 0x19 < (byte)(bVar5 + 0x9f)) &&
            ((((0x3d < bVar5 - 0x22 ||
               ((0x2000000000000025U >> ((ulong)(bVar5 - 0x22) & 0x3f) & 1) == 0)) &&
              (bVar5 != 0x7d)) && (bVar5 != 0x7b)))) break;
    sVar13 = sVar13 - 1;
    lVar8 = lVar8 + -1;
  }
  local_50 = (undefined1  [8])-(long)(left.len + lVar8);
  for (; (pbVar12 < pbVar1 && (*pbVar12 == 0x20)); pbVar12 = pbVar12 + 1) {
    sVar13 = sVar13 - 1;
  }
  pnVar2 = r->connection->log;
  right.data = (u_char *)pnVar14;
  if ((pnVar2->log_level & 0x100) != 0) {
    flags = "left: \"%V\"";
    ngx_log_error_core(8,pnVar2,0,"left: \"%V\"",local_50);
  }
  nVar9 = ngx_http_ssi_evaluate_string
                    (r,(ngx_http_ssi_ctx_t *)local_50,(ngx_str_t *)0x0,(ngx_uint_t)flags);
  if (nVar9 != 0) {
    return nVar9;
  }
  pnVar10 = r->connection;
  if ((pnVar10->log->log_level & 0x100) != 0) {
    flags = "evaluated left: \"%V\"";
    ngx_log_error_core(8,pnVar10->log,0,"evaluated left: \"%V\"",local_50);
    pnVar10 = extraout_RAX;
  }
  if (sVar13 == 0) {
    bVar5 = ctx->field_0x1a0 | 0x60;
    if (local_50 == (undefined1  [8])0x0) {
      bVar5 = ctx->field_0x1a0 & 0xdc;
    }
    ctx->field_0x1a0 = (bVar5 & 0xfc) + 1;
    return 0;
  }
  if ((pbVar12 < pbVar1) && (*pbVar12 == 0x3d)) {
    left.data._4_4_ = (undefined4)CONCAT71((int7)((ulong)pnVar10 >> 8),1);
    lVar8 = 1;
  }
  else {
    if ((pbVar1 <= pbVar12 + 1) || ((*pbVar12 != 0x21 || (pbVar12[1] != 0x3d)))) goto LAB_0015997b;
    lVar8 = 2;
    left.data._4_4_ = 0;
  }
  for (right.len = (size_t)(pbVar12 + lVar8); (right.len < pbVar1 && (*(byte *)right.len == 0x20));
      right.len = right.len + 1) {
  }
  pbVar12 = pbVar1 + -1;
  if (right.len < pbVar12) {
    bVar5 = *(byte *)right.len;
    flags = (char *)(ulong)bVar5;
    if (bVar5 != 0x2f) {
      if ((bVar5 == 0x5c) && (*(byte *)(right.len + 1) == 0x2f)) {
        right.len = (size_t)(right.len + 1);
      }
      goto LAB_0015981a;
    }
    if (*pbVar12 != 0x2f) {
LAB_0015997b:
      pnVar2 = r->connection->log;
      if (3 < pnVar2->log_level) {
        ngx_log_error_core(4,pnVar2,0,"invalid expression in \"%V\"",right.data);
      }
      return 1;
    }
    right.len = right.len + 1;
    pnVar14 = (ngx_str_t *)0x2;
    bVar4 = true;
  }
  else {
LAB_0015981a:
    bVar4 = false;
    pnVar14 = (ngx_str_t *)0x0;
    pbVar12 = pbVar1;
  }
  auStack_68 = (undefined1  [8])(pbVar12 + -right.len);
  pnVar2 = r->connection->log;
  if ((pnVar2->log_level & 0x100) != 0) {
    flags = "right: \"%V\"";
    ngx_log_error_core(8,pnVar2,0,"right: \"%V\"",auStack_68);
  }
  nVar9 = ngx_http_ssi_evaluate_string(r,(ngx_http_ssi_ctx_t *)auStack_68,pnVar14,(ngx_uint_t)flags)
  ;
  if (nVar9 != 0) {
    return nVar9;
  }
  pnVar2 = r->connection->log;
  if ((pnVar2->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar2,0,"evaluated right: \"%V\"",auStack_68);
  }
  if (bVar4) {
    *(byte *)((long)(u_char **)auStack_68 + right.len) = 0;
    errstr[0x3f8] = auStack_68[0];
    errstr[0x3f9] = auStack_68[1];
    errstr[0x3fa] = auStack_68[2];
    errstr[0x3fb] = auStack_68[3];
    errstr[0x3fc] = auStack_68[4];
    errstr[0x3fd] = auStack_68[5];
    errstr[0x3fe] = auStack_68[6];
    errstr[0x3ff] = auStack_68[7];
    local_a8 = 0x400;
    local_a0 = local_4e8;
    nVar9 = ngx_regex_compile((ngx_regex_compile_t *)(errstr + 0x3f8));
    if (nVar9 != 0) {
      pnVar2 = r->connection->log;
      if (3 < pnVar2->log_level) {
        ngx_log_error_core(4,pnVar2,0,"%V",&local_a8);
        return 1;
      }
      return 1;
    }
    pvVar11 = ngx_palloc(r->pool,0xc);
    if (pvVar11 == (void *)0x0) {
      return -1;
    }
    uVar7 = pcre_exec(uRam0000000000000000,uRam0000000000000008,left.len,
                      (ulong)local_50 & 0xffffffff,0,0,pvVar11,3);
    if ((int)uVar7 < -1) {
      pnVar2 = r->connection->log;
      if (1 < pnVar2->log_level) {
        ngx_log_error_core(2,pnVar2,0,"pcre_exec() failed: %d on \"%V\" using \"%V\"",(ulong)uVar7,
                           local_50,(ngx_http_ssi_ctx_t *)auStack_68);
        return 1;
      }
      return 1;
    }
    if (uVar7 == 0xffffffff) {
LAB_00159ba3:
      if (left.data._4_1_ == '\0') goto LAB_00159bad;
    }
    else {
      pvVar3 = r->main->ctx[ngx_http_ssi_filter_module.ctx_index];
      *(ulong *)((long)pvVar3 + 0x188) = (ulong)uVar7;
      *(void **)((long)pvVar3 + 400) = pvVar11;
      *(size_t *)((long)pvVar3 + 0x198) = left.len;
      if (left.data._4_1_ != '\0') goto LAB_00159bad;
    }
LAB_00159957:
    bVar5 = ctx->field_0x1a0 & 0xdf;
  }
  else {
    if (local_50 != auStack_68) goto LAB_00159ba3;
    iVar6 = strncmp((char *)left.len,(char *)right.len,(size_t)local_50);
    if ((bool)left.data._4_1_ == (iVar6 != 0)) goto LAB_00159957;
LAB_00159bad:
    bVar5 = ctx->field_0x1a0 | 0x60;
  }
  bVar5 = (bVar5 & 0xfc) + 1;
LAB_001596e1:
  ctx->field_0x1a0 = bVar5;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_ssi_if(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t **params)
{
    u_char       *p, *last;
    ngx_str_t    *expr, left, right;
    ngx_int_t     rc;
    ngx_uint_t    negative, noregex, flags;

    if (ctx->command.len == 2) {
        if (ctx->conditional) {
            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "the \"if\" command inside the \"if\" command");
            return NGX_HTTP_SSI_ERROR;
        }
    }

    if (ctx->output_chosen) {
        ctx->output = 0;
        return NGX_OK;
    }

    expr = params[NGX_HTTP_SSI_IF_EXPR];

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "ssi if expr=\"%V\"", expr);

    left.data = expr->data;
    last = expr->data + expr->len;

    for (p = left.data; p < last; p++) {
        if (*p >= 'A' && *p <= 'Z') {
            *p |= 0x20;
            continue;
        }

        if ((*p >= 'a' && *p <= 'z')
             || (*p >= '0' && *p <= '9')
             || *p == '$' || *p == '{' || *p == '}' || *p == '_'
             || *p == '"' || *p == '\'')
        {
            continue;
        }

        break;
    }

    left.len = p - left.data;

    while (p < last && *p == ' ') {
        p++;
    }

    flags = 0;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "left: \"%V\"", &left);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &left, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated left: \"%V\"", &left);

    if (p == last) {
        if (left.len) {
            ctx->output = 1;
            ctx->output_chosen = 1;

        } else {
            ctx->output = 0;
        }

        ctx->conditional = NGX_HTTP_SSI_COND_IF;

        return NGX_OK;
    }

    if (p < last && *p == '=') {
        negative = 0;
        p++;

    } else if (p + 1 < last && *p == '!' && *(p + 1) == '=') {
        negative = 1;
        p += 2;

    } else {
        goto invalid_expression;
    }

    while (p < last && *p == ' ') {
        p++;
    }

    if (p < last - 1 && *p == '/') {
        if (*(last - 1) != '/') {
            goto invalid_expression;
        }

        noregex = 0;
        flags = NGX_HTTP_SSI_ADD_ZERO;
        last--;
        p++;

    } else {
        noregex = 1;
        flags = 0;

        if (p < last - 1 && p[0] == '\\' && p[1] == '/') {
            p++;
        }
    }

    right.len = last - p;
    right.data = p;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "right: \"%V\"", &right);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &right, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated right: \"%V\"", &right);

    if (noregex) {
        if (left.len != right.len) {
            rc = -1;

        } else {
            rc = ngx_strncmp(left.data, right.data, right.len);
        }

    } else {
        right.data[right.len] = '\0';

        rc = ngx_http_ssi_regex_match(r, &right, &left);

        if (rc == NGX_OK) {
            rc = 0;
        } else if (rc == NGX_DECLINED) {
            rc = -1;
        } else {
            return rc;
        }
    }

    if ((rc == 0 && !negative) || (rc != 0 && negative)) {
        ctx->output = 1;
        ctx->output_chosen = 1;

    } else {
        ctx->output = 0;
    }

    ctx->conditional = NGX_HTTP_SSI_COND_IF;

    return NGX_OK;

invalid_expression:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid expression in \"%V\"", expr);

    return NGX_HTTP_SSI_ERROR;
}